

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParseFromCord(Parser *this,Cord *input,Message *output)

{
  Nullable<absl::cord_internal::CordRep_*> buffer;
  byte bVar1;
  ErrorCollector *pEVar2;
  bool bVar3;
  Nonnull<char_*> pcVar4;
  ulong uVar5;
  ulong uVar6;
  size_t i;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  CordInputStream input_stream;
  string local_178;
  CordRepBtree *local_158;
  CordRepBtree *local_150;
  undefined1 local_148 [80];
  undefined1 local_f8 [64];
  CordRepBtree *local_b8;
  CordRepBtree *local_b0;
  CordRepBtree *local_a8;
  char *local_a0;
  
  bVar1 = (input->contents_).data_.rep_.field_0.data[0];
  uVar6 = (ulong)(char)bVar1;
  if ((uVar6 & 1) == 0) {
    uVar5 = uVar6 >> 1;
  }
  else {
    uVar5 = ((input->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar5 >> 0x1f != 0) {
    pEVar2 = this->error_collector_;
    if ((bVar1 & 1) == 0) {
      i = uVar6 >> 1;
    }
    else {
      i = ((input->contents_).data_.rep_.field_0.as_tree.rep)->length;
    }
    buffer = (Nullable<absl::cord_internal::CordRep_*>)(local_148 + 0x30);
    local_148._32_8_ =
         absl::lts_20250127::numbers_internal::FastIntToBuffer(i,(Nonnull<char_*>)buffer);
    local_148._32_8_ = local_148._32_8_ + -(long)buffer;
    local_148._40_8_ = buffer;
    pcVar4 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       (0x7fffffff,(Nonnull<char_*>)local_148);
    local_158 = (CordRepBtree *)(pcVar4 + -(long)local_148);
    local_f8._0_8_ = (_func_int **)0x16;
    local_f8._8_8_ = "Input size too large: ";
    local_f8._16_8_ = local_148._32_8_;
    local_f8._24_8_ = local_148._40_8_;
    local_f8._32_8_ = 6;
    local_f8._40_8_ = " bytes";
    local_f8._48_4_ = 3;
    local_f8[0x34] = '\0';
    local_f8[0x35] = '\0';
    local_f8[0x36] = '\0';
    local_f8[0x37] = '\0';
    local_f8._56_8_ = " > ";
    local_a8 = (CordRepBtree *)0x7;
    local_a0 = " bytes.";
    pieces._M_len = (size_type)" > ";
    pieces._M_array = (iterator)&DAT_00000006;
    local_150 = (CordRepBtree *)local_148;
    local_b8 = local_158;
    local_b0 = (CordRepBtree *)local_148;
    absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
              (&local_178,(strings_internal *)local_f8,pieces);
    (*pEVar2->_vptr_ErrorCollector[2])
              (pEVar2,0xffffffff,0,local_178._M_string_length,local_178._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    if (uVar5 >> 0x1f != 0) {
      return false;
    }
  }
  io::CordInputStream::CordInputStream((CordInputStream *)local_f8,input);
  bVar3 = Parse(this,(ZeroCopyInputStream *)local_f8,output);
  return bVar3;
}

Assistant:

bool TextFormat::Parser::ParseFromCord(const absl::Cord& input,
                                       Message* output) {
  DO(CheckParseInputSize(input, error_collector_));
  io::CordInputStream input_stream(&input);
  return Parse(&input_stream, output);
}